

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::operator+(Bstrlib *this,char c,String *b)

{
  uchar *extraout_RDX;
  String SVar1;
  String local_30;
  String *local_20;
  String *b_local;
  Bstrlib *pBStack_10;
  char c_local;
  
  local_20 = b;
  b_local._7_1_ = c;
  pBStack_10 = this;
  String::String(&local_30,c);
  String::operator+((String *)this,&local_30);
  String::~String(&local_30);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String operator+(char c, const String& b)
    {
        return String(c) + b;
    }